

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O1

ch_table_entry * find_entry(ch_table_entry *entries,uint32_t capacity,ch_string *key)

{
  ch_table_entry *pcVar1;
  bool bVar2;
  ch_table_entry *in_RAX;
  ch_table_entry *pcVar3;
  uint uVar4;
  ch_table_entry *pcVar5;
  ch_table_entry *pcVar6;
  
  uVar4 = key->hash & capacity - 1;
  pcVar5 = (ch_table_entry *)0x0;
  do {
    pcVar1 = entries + uVar4;
    if (pcVar1->key == (ch_string *)0x0) {
      pcVar3 = pcVar5;
      if (pcVar5 == (ch_table_entry *)0x0) {
        pcVar3 = pcVar1;
      }
      pcVar6 = pcVar3;
      if ((pcVar1->value).type != PRIMITIVE_NULL) goto LAB_00102cd5;
      bVar2 = false;
    }
    else {
      pcVar6 = pcVar5;
      if (pcVar1->key == key) {
        bVar2 = false;
        pcVar3 = pcVar1;
      }
      else {
LAB_00102cd5:
        uVar4 = uVar4 + 1 & capacity - 1;
        bVar2 = true;
        pcVar3 = in_RAX;
        pcVar5 = pcVar6;
      }
    }
    in_RAX = pcVar3;
    if (!bVar2) {
      return pcVar3;
    }
  } while( true );
}

Assistant:

static ch_table_entry *find_entry(ch_table_entry *entries, uint32_t capacity,
                                  ch_string *key) {
  uint32_t index = key->hash & (capacity - 1);
  ch_table_entry *tombstone = NULL;
  for (;;) {
    ch_table_entry *entry = &entries[index];
    if (entry->key == NULL) {
      if (IS_NULL(entry->value)) {
        return tombstone != NULL ? tombstone : entry;
      } else {
        if (tombstone == NULL)
          tombstone = entry;
      }
    } else if (entry->key == key) {
      return entry;
    }

    index = (index + 1) & (capacity - 1);
  }
}